

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O1

int uv_async_send(uv_async_t *handle)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  size_t __n;
  char *__buf;
  
  if (handle->pending == 0) {
    LOCK();
    iVar1 = handle->pending;
    if (iVar1 == 0) {
      handle->pending = 1;
      iVar1 = 0;
    }
    UNLOCK();
    if (iVar1 == 0) {
      iVar1 = handle->loop->async_wfd;
      if (iVar1 == -1) {
        iVar1 = (handle->loop->async_io_watcher).fd;
        __buf = "\x01";
        __n = 8;
      }
      else {
        __buf = "";
        __n = 1;
      }
      do {
        uVar2 = write(iVar1,__buf,__n);
        if ((uVar2 & 0xffffffff) != 0xffffffff) break;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      if (((long)(int)uVar2 != __n) &&
         (((int)uVar2 != -1 || (piVar3 = __errno_location(), *piVar3 != 0xb)))) {
        abort();
      }
    }
  }
  return 0;
}

Assistant:

int uv_async_send(uv_async_t* handle) {
  /* Do a cheap read first. */
  if (ACCESS_ONCE(int, handle->pending) != 0)
    return 0;

  if (cmpxchgi(&handle->pending, 0, 1) == 0)
    uv__async_send(handle->loop);

  return 0;
}